

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__encode_uint16_linear_scaled_AR(void *outputp,int width_times_channels,float *encode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  unsigned_short *puVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  __m128 e_1;
  __m128i tmp1_1;
  __m128i tmp0_1;
  __m128i i_1;
  __m128 e;
  __m128i tmp1;
  __m128i tmp0;
  __m128i i;
  __m128 e1;
  __m128 e0;
  float *end_encode_m8;
  unsigned_short *end_output;
  unsigned_short *output;
  float *encode_local;
  int width_times_channels_local;
  void *outputp_local;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  float local_1c8;
  float local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_f8;
  undefined8 local_d8;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  
  puVar18 = (unsigned_short *)((long)outputp + (long)width_times_channels * 2);
  if (width_times_channels < 8) {
    output = (unsigned_short *)encode;
    for (end_output = (unsigned_short *)((long)outputp + 8); end_output <= puVar18;
        end_output = end_output + 4) {
      local_548 = (float)*(undefined8 *)output;
      fStack_544 = (float)((ulong)*(undefined8 *)output >> 0x20);
      fStack_540 = (float)*(undefined8 *)(output + 4);
      fStack_53c = (float)((ulong)*(undefined8 *)(output + 4) >> 0x20);
      uVar1 = CONCAT44(local_548 * 65535.0 + 0.5,fStack_544 * 65535.0 + 0.5);
      uVar2 = CONCAT44(fStack_540 * 65535.0 + 0.5,fStack_53c * 65535.0 + 0.5);
      auVar9._8_8_ = uVar2;
      auVar9._0_8_ = uVar1;
      auVar8._8_8_ = 0x477fff00477fff00;
      auVar8._0_8_ = 0x477fff00477fff00;
      auVar20 = minps(auVar9,auVar8);
      auVar20 = maxps(auVar20,ZEXT816(0));
      local_198 = auVar20._0_4_;
      fStack_194 = auVar20._4_4_;
      fStack_190 = auVar20._8_4_;
      fStack_18c = auVar20._12_4_;
      auVar7._8_8_ = uVar2;
      auVar7._0_8_ = uVar1;
      auVar20._8_8_ = 0x477fff00477fff00;
      auVar20._0_8_ = 0x477fff00477fff00;
      auVar20 = minps(auVar7,auVar20);
      auVar20 = maxps(auVar20,ZEXT816(0));
      local_1a8 = auVar20._0_4_;
      fStack_1a4 = auVar20._4_4_;
      fStack_1a0 = auVar20._8_4_;
      fStack_19c = auVar20._12_4_;
      local_288 = (int)stbir__s32_32768[0];
      iStack_284 = (int)((ulong)stbir__s32_32768[0] >> 0x20);
      iStack_280 = (int)stbir__s32_32768[1];
      iStack_27c = (int)((ulong)stbir__s32_32768[1] >> 0x20);
      auVar15._4_4_ = (int)fStack_194 - iStack_284;
      auVar15._0_4_ = (int)local_198 - local_288;
      auVar15._12_4_ = (int)fStack_18c - iStack_27c;
      auVar15._8_4_ = (int)fStack_190 - iStack_280;
      auVar14._4_4_ = (int)fStack_1a4 - iStack_284;
      auVar14._0_4_ = (int)local_1a8 - local_288;
      auVar14._12_4_ = (int)fStack_19c - iStack_27c;
      auVar14._8_4_ = (int)fStack_1a0 - iStack_280;
      auVar20 = packssdw(auVar15,auVar14);
      local_38 = auVar20._0_2_;
      sStack_36 = auVar20._2_2_;
      sStack_34 = auVar20._4_2_;
      sStack_32 = auVar20._6_2_;
      local_48 = (short)stbir__s16_32768[0];
      sStack_46 = (short)((ulong)stbir__s16_32768[0] >> 0x10);
      sStack_44 = (short)((ulong)stbir__s16_32768[0] >> 0x20);
      sStack_42 = (short)((ulong)stbir__s16_32768[0] >> 0x30);
      tmp0_1[1] = CONCAT26(sStack_32 - sStack_42,
                           CONCAT24(sStack_34 - sStack_44,
                                    CONCAT22(sStack_36 - sStack_46,local_38 - local_48)));
      *(longlong *)(end_output + -4) = tmp0_1[1];
      output = output + 8;
    }
    for (end_output = end_output + -4; end_output < puVar18; end_output = end_output + 2) {
      local_d8 = CONCAT44(0x3f000000,*(float *)(output + 2) * 65535.0 + 0.5);
      auVar6._8_8_ = 0x3f0000003f000000;
      auVar6._0_8_ = local_d8;
      auVar5._8_8_ = 0x477fff00477fff00;
      auVar5._0_8_ = 0x477fff00477fff00;
      auVar20 = minps(auVar6,auVar5);
      auVar20 = maxps(auVar20,ZEXT816(0));
      local_1b8 = auVar20._0_4_;
      *end_output = (unsigned_short)(int)local_1b8;
      local_f8 = CONCAT44(0x3f000000,*(float *)output * 65535.0 + 0.5);
      auVar4._8_8_ = 0x3f0000003f000000;
      auVar4._0_8_ = local_f8;
      auVar3._8_8_ = 0x477fff00477fff00;
      auVar3._0_8_ = 0x477fff00477fff00;
      auVar20 = minps(auVar4,auVar3);
      auVar20 = maxps(auVar20,ZEXT816(0));
      local_1c8 = auVar20._0_4_;
      end_output[1] = (unsigned_short)(int)local_1c8;
      output = output + 4;
    }
  }
  else {
    end_output = (unsigned_short *)outputp;
    output = (unsigned_short *)encode;
    do {
      do {
        local_508 = (float)*(undefined8 *)output;
        fStack_504 = (float)((ulong)*(undefined8 *)output >> 0x20);
        fStack_500 = (float)*(undefined8 *)(output + 4);
        fStack_4fc = (float)((ulong)*(undefined8 *)(output + 4) >> 0x20);
        local_528 = (float)*(undefined8 *)(output + 8);
        fStack_524 = (float)((ulong)*(undefined8 *)(output + 8) >> 0x20);
        fStack_520 = (float)*(undefined8 *)(output + 0xc);
        fStack_51c = (float)((ulong)*(undefined8 *)(output + 0xc) >> 0x20);
        auVar13._4_4_ = local_508 * 65535.0 + 0.5;
        auVar13._0_4_ = fStack_504 * 65535.0 + 0.5;
        auVar13._12_4_ = fStack_500 * 65535.0 + 0.5;
        auVar13._8_4_ = fStack_4fc * 65535.0 + 0.5;
        auVar11._4_4_ = local_528 * 65535.0 + 0.5;
        auVar11._0_4_ = fStack_524 * 65535.0 + 0.5;
        auVar11._12_4_ = fStack_520 * 65535.0 + 0.5;
        auVar11._8_4_ = fStack_51c * 65535.0 + 0.5;
        auVar12._8_8_ = 0x477fff00477fff00;
        auVar12._0_8_ = 0x477fff00477fff00;
        auVar20 = minps(auVar13,auVar12);
        auVar20 = maxps(auVar20,ZEXT816(0));
        local_178 = auVar20._0_4_;
        fStack_174 = auVar20._4_4_;
        fStack_170 = auVar20._8_4_;
        fStack_16c = auVar20._12_4_;
        auVar10._8_8_ = 0x477fff00477fff00;
        auVar10._0_8_ = 0x477fff00477fff00;
        auVar20 = minps(auVar11,auVar10);
        auVar20 = maxps(auVar20,ZEXT816(0));
        local_188 = auVar20._0_4_;
        fStack_184 = auVar20._4_4_;
        fStack_180 = auVar20._8_4_;
        fStack_17c = auVar20._12_4_;
        local_248 = (int)stbir__s32_32768[0];
        iStack_244 = (int)((ulong)stbir__s32_32768[0] >> 0x20);
        iStack_240 = (int)stbir__s32_32768[1];
        iStack_23c = (int)((ulong)stbir__s32_32768[1] >> 0x20);
        auVar17._4_4_ = (int)fStack_174 - iStack_244;
        auVar17._0_4_ = (int)local_178 - local_248;
        auVar17._12_4_ = (int)fStack_16c - iStack_23c;
        auVar17._8_4_ = (int)fStack_170 - iStack_240;
        auVar16._4_4_ = (int)fStack_184 - iStack_244;
        auVar16._0_4_ = (int)local_188 - local_248;
        auVar16._12_4_ = (int)fStack_17c - iStack_23c;
        auVar16._8_4_ = (int)fStack_180 - iStack_240;
        auVar20 = packssdw(auVar17,auVar16);
        local_18 = auVar20._0_2_;
        sStack_16 = auVar20._2_2_;
        sStack_14 = auVar20._4_2_;
        sStack_12 = auVar20._6_2_;
        sStack_10 = auVar20._8_2_;
        sStack_e = auVar20._10_2_;
        sStack_c = auVar20._12_2_;
        sStack_a = auVar20._14_2_;
        local_28 = (short)stbir__s16_32768[0];
        sStack_26 = (short)((ulong)stbir__s16_32768[0] >> 0x10);
        sStack_24 = (short)((ulong)stbir__s16_32768[0] >> 0x20);
        sStack_22 = (short)((ulong)stbir__s16_32768[0] >> 0x30);
        sStack_20 = (short)stbir__s16_32768[1];
        sStack_1e = (short)((ulong)stbir__s16_32768[1] >> 0x10);
        sStack_1c = (short)((ulong)stbir__s16_32768[1] >> 0x20);
        sStack_1a = (short)((ulong)stbir__s16_32768[1] >> 0x30);
        tmp0[1] = CONCAT26(sStack_12 - sStack_22,
                           CONCAT24(sStack_14 - sStack_24,
                                    CONCAT22(sStack_16 - sStack_26,local_18 - local_28)));
        i[0]._0_2_ = sStack_10 - sStack_20;
        i[0]._2_2_ = sStack_e - sStack_1e;
        i[0]._4_2_ = sStack_c - sStack_1c;
        i[0]._6_2_ = sStack_a - sStack_1a;
        *(longlong *)end_output = tmp0[1];
        *(longlong *)(end_output + 4) = i[0];
        output = output + 0x10;
        end_output = end_output + 8;
      } while (end_output <= puVar18 + -8);
      bVar19 = end_output != puVar18;
      end_output = puVar18 + -8;
      output = (unsigned_short *)(encode + (long)width_times_channels + -8);
    } while (bVar19);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__encode_uint16_linear_scaled)( void * outputp, int width_times_channels, float const * encode )
{
  unsigned short STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned short*) outputp;
  unsigned short * end_output = ( (unsigned short*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  {
    if ( width_times_channels >= stbir__simdfX_float_count*2 )
    {
      float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
      end_output -= stbir__simdfX_float_count*2;
      STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
      for(;;)
      {
        stbir__simdfX e0, e1;
        stbir__simdiX i;
        STBIR_SIMD_NO_UNROLL(encode);
        stbir__simdfX_madd_mem( e0, STBIR_simd_point5X, STBIR_max_uint16_as_floatX, encode );
        stbir__simdfX_madd_mem( e1, STBIR_simd_point5X, STBIR_max_uint16_as_floatX, encode+stbir__simdfX_float_count );
        stbir__encode_simdfX_unflip( e0 );
        stbir__encode_simdfX_unflip( e1 );
        stbir__simdfX_pack_to_words( i, e0, e1 );
        stbir__simdiX_store( output, i );
        encode += stbir__simdfX_float_count*2;
        output += stbir__simdfX_float_count*2;
        if ( output <= end_output )
          continue;
        if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
          break;
        output = end_output;     // backup and do last couple
        encode = end_encode_m8;
      }
      return;
    }
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e;
    stbir__simdi i;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e, encode );
    stbir__simdf_madd( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), e );
    stbir__encode_simdf4_unflip( e );
    stbir__simdf_pack_to_8words( i, e, e );  // only use first 4
    stbir__simdi_store2( output-4, i );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    stbir__simdf e;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_madd1_mem( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), encode+stbir__encode_order0 ); output[0] = stbir__simdf_convert_float_to_short( e );
    #if stbir__coder_min_num >= 2
    stbir__simdf_madd1_mem( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), encode+stbir__encode_order1 ); output[1] = stbir__simdf_convert_float_to_short( e );
    #endif
    #if stbir__coder_min_num >= 3
    stbir__simdf_madd1_mem( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), encode+stbir__encode_order2 ); output[2] = stbir__simdf_convert_float_to_short( e );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    float f;
    STBIR_SIMD_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[0-4] = (unsigned short)f;
    f = encode[stbir__encode_order1] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[1-4] = (unsigned short)f;
    f = encode[stbir__encode_order2] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[2-4] = (unsigned short)f;
    f = encode[stbir__encode_order3] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[3-4] = (unsigned short)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[0] = (unsigned short)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[1] = (unsigned short)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[2] = (unsigned short)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
  #endif
}